

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::SetSecurePendingDataset
          (CommissionerImpl *this,ErrorHandler *aHandler,uint32_t aMaxRetrievalTimer,
          PendingOperationalDataset *aDataset)

{
  char cVar1;
  ErrorCode EVar2;
  int iVar3;
  char *pcVar4;
  Error *pEVar5;
  uint64_t aInteger;
  function<void_(ot::commissioner::Error)> *this_00;
  __0 *this_01;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  undefined1 local_378 [8];
  _Alloc_hider local_370;
  undefined1 local_368 [24];
  parse_func local_350 [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  undefined1 local_328 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_320;
  ProxyClient *local_300;
  ByteArray secureDissemination;
  Error error;
  Address pbbrAddr;
  writer write;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  _Any_data local_258;
  code *local_248;
  code *pcStack_240;
  string uri;
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_1f0 [40];
  Request request;
  anon_class_272_4_c83933d0 onMeshLocalPrefixResponse;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  pbbrAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  secureDissemination.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbbrAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pbbrAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  secureDissemination.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  secureDissemination.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uri._M_dataplus._M_p = (pointer)&uri.field_2;
  uri._M_string_length = 0;
  uri.field_2._M_local_buf[0] = '\0';
  coap::Message::Message(&request,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function(&onResponse.aHandler,aHandler);
  onMeshLocalPrefixResponse.this = this;
  std::function<void_(ot::commissioner::Error)>::function
            (&onMeshLocalPrefixResponse.aHandler,aHandler);
  onMeshLocalPrefixResponse.aMaxRetrievalTimer = aMaxRetrievalTimer;
  PendingOperationalDataset::PendingOperationalDataset(&onMeshLocalPrefixResponse.aDataset,aDataset)
  ;
  if (((aDataset->super_ActiveOperationalDataset).mPresentFlags & 0x20) == 0) {
    local_378._0_4_ = none_type;
    local_370._M_p = "Delay Timer is mandatory for a Secure Pending Operational Dataset";
    local_368._0_8_ = (pointer)0x41;
    local_368._8_8_ = 0;
    local_350[0] = (parse_func)0x0;
    pcVar4 = "Delay Timer is mandatory for a Secure Pending Operational Dataset";
    local_368._16_8_ = local_378;
    write.handler_ = (format_string_checker<char> *)local_378;
    while (pcVar4 != "") {
      cVar1 = *pcVar4;
      pcVar6 = pcVar4;
      while (cVar1 != '{') {
        pcVar6 = pcVar6 + 1;
        if (pcVar6 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar4,"");
          goto LAB_001759ca;
        }
        cVar1 = *pcVar6;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar4,pcVar6);
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar6,"",(format_string_checker<char> *)local_378);
    }
LAB_001759ca:
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_378;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_348,(v10 *)"Delay Timer is mandatory for a Secure Pending Operational Dataset"
               ,(string_view)ZEXT816(0x41),args);
    local_328._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)&local_320,(string *)&local_348);
LAB_00175b71:
    Error::operator=(&error,(Error *)local_328);
    std::__cxx11::string::~string((string *)&local_320);
    this_02 = &local_348;
  }
  else {
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
    if ((char)iVar3 == '\0') {
      local_378._0_4_ = none_type;
      local_370._M_p = "the commissioner is not active";
      local_368._0_8_ = (pointer)0x1e;
      local_368._8_8_ = 0;
      local_350[0] = (parse_func)0x0;
      pcVar4 = "the commissioner is not active";
      local_368._16_8_ = local_378;
      while (pcVar6 = pcVar4, pcVar6 != "") {
        pcVar4 = pcVar6 + 1;
        if (*pcVar6 == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = pcVar6 + 2;
        }
        else if (*pcVar6 == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar6,"",(format_string_checker<char> *)local_378);
        }
      }
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_378;
      ::fmt::v10::vformat_abi_cxx11_(&local_348,(v10 *)0x1f85d8,(string_view)ZEXT816(0x1e),args_00);
      local_328._0_4_ = kInvalidState;
      std::__cxx11::string::string((string *)&local_320,(string *)&local_348);
      goto LAB_00175b71;
    }
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 == '\0') {
      local_378._0_4_ = none_type;
      local_370._M_p = "sending MGMT_SEC_PENDING_SET.req is only valid in CCM mode";
      local_368._0_8_ = (pointer)0x3a;
      local_368._8_8_ = 0;
      local_350[0] = (parse_func)0x0;
      pcVar4 = "sending MGMT_SEC_PENDING_SET.req is only valid in CCM mode";
      local_368._16_8_ = local_378;
      write.handler_ = (format_string_checker<char> *)local_378;
      while (pcVar4 != "") {
        cVar1 = *pcVar4;
        pcVar6 = pcVar4;
        while (cVar1 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar4,"");
            goto LAB_00175b3e;
          }
          cVar1 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,pcVar4,pcVar6);
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_378);
      }
LAB_00175b3e:
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_378;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_348,(v10 *)"sending MGMT_SEC_PENDING_SET.req is only valid in CCM mode",
                 (string_view)ZEXT816(0x3a),args_01);
      local_328._0_4_ = kInvalidState;
      std::__cxx11::string::string((string *)&local_320,(string *)&local_348);
      goto LAB_00175b71;
    }
    if ((this->mProxyClient).mMeshLocalPrefix.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->mProxyClient).mMeshLocalPrefix.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_248 = (code *)0x0;
      pcStack_240 = (code *)0x0;
      local_258._M_unused._M_object = (void *)0x0;
      local_258._8_8_ = 0;
      this_01 = (__0 *)operator_new(0x110);
      SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)
      ::$_0::__0(this_01,&onMeshLocalPrefixResponse);
      pcStack_240 = std::
                    _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:877:38)>
                    ::_M_invoke;
      local_248 = std::
                  _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:877:38)>
                  ::_M_manager;
      local_258._M_unused._0_8_ = (undefined8)this_01;
      ProxyClient::FetchMeshLocalPrefix(&this->mProxyClient,(ErrorHandler *)&local_258);
      std::_Function_base::~_Function_base((_Function_base *)&local_258);
      goto LAB_00175b95;
    }
    std::__cxx11::string::string((string *)local_328,"/c/sp",(allocator *)&local_348);
    local_300 = &this->mProxyClient;
    coap::Message::SetUriPath((Error *)local_378,&request,(string *)local_328);
    pEVar5 = Error::operator=(&error,(Error *)local_378);
    EVar2 = pEVar5->mCode;
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)local_328);
    if (EVar2 != kNone) goto LAB_00175b95;
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
    tlv::Tlv::Tlv((Tlv *)local_328,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
    AppendTlv((Error *)local_378,&request,(Tlv *)local_328);
    pEVar5 = Error::operator=(&error,(Error *)local_378);
    EVar2 = pEVar5->mCode;
    std::__cxx11::string::~string((string *)&local_370);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_320);
    if (EVar2 != kNone) goto LAB_00175b95;
    ProxyClient::GetAnycastLocator((Address *)local_378,local_300,0xfc38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&pbbrAddr.mBytes,local_378);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_378);
    Address::ToString_abi_cxx11_((string *)&write,&pbbrAddr);
    std::operator+(&local_348,"coaps://[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&write);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                   &local_348,"]");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                   "/c/pg");
    std::__cxx11::string::operator=((string *)&uri,(string *)local_378);
    std::__cxx11::string::~string((string *)local_378);
    std::__cxx11::string::~string((string *)local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&write);
    aInteger = Timestamp::Encode(&aDataset->mPendingTimestamp);
    utils::Encode<unsigned_long>(&secureDissemination,aInteger);
    utils::Encode<unsigned_int>(&secureDissemination,aMaxRetrievalTimer);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&secureDissemination,
               (const_iterator)
               secureDissemination.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )uri._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(uri._M_dataplus._M_p + uri._M_string_length));
    tlv::Tlv::Tlv((Tlv *)local_328,kSecureDissemination,&secureDissemination,kMeshCoP);
    AppendTlv((Error *)local_378,&request,(Tlv *)local_328);
    pEVar5 = Error::operator=(&error,(Error *)local_378);
    EVar2 = pEVar5->mCode;
    std::__cxx11::string::~string((string *)&local_370);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_320);
    if (EVar2 != kNone) goto LAB_00175b95;
    EncodePendingOperationalDataset((Error *)local_378,&request,aDataset);
    pEVar5 = Error::operator=(&error,(Error *)local_378);
    EVar2 = pEVar5->mCode;
    std::__cxx11::string::~string((string *)&local_370);
    if (EVar2 != kNone) goto LAB_00175b95;
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 != '\0') {
      SignRequest((Error *)local_378,this,&request,kMeshCoP,true);
      pEVar5 = Error::operator=(&error,(Error *)local_378);
      EVar2 = pEVar5->mCode;
      std::__cxx11::string::~string((string *)&local_370);
      if (EVar2 != kNone) goto LAB_00175b95;
    }
    local_268 = (code *)0x0;
    pcStack_260 = (code *)0x0;
    local_278._M_unused._M_object = (void *)0x0;
    local_278._8_8_ = 0;
    this_00 = (function<void_(ot::commissioner::Error)> *)operator_new(0x20);
    std::function<void_(ot::commissioner::Error)>::function(this_00,&onResponse.aHandler);
    pcStack_260 = std::
                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:873:23)>
                  ::_M_invoke;
    local_268 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:873:23)>
                ::_M_manager;
    local_278._M_unused._M_object = this_00;
    ProxyClient::SendRequest(local_300,&request,(ResponseHandler *)&local_278,&pbbrAddr,0xf0bf);
    std::_Function_base::~_Function_base((_Function_base *)&local_278);
    std::__cxx11::string::string((string *)local_328,"mgmt",(allocator *)&write);
    local_378._0_4_ = none_type;
    local_370._M_p = "sent MGMT_SEC_PENDING_SET.req";
    local_368._0_8_ = (pointer)0x1d;
    local_368._8_8_ = 0;
    local_350[0] = (parse_func)0x0;
    pcVar4 = "sent MGMT_SEC_PENDING_SET.req";
    local_368._16_8_ = local_378;
    while (pcVar6 = pcVar4, pcVar6 != "") {
      pcVar4 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_378);
      }
    }
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)local_378;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_348,(v10 *)"sent MGMT_SEC_PENDING_SET.req",(string_view)ZEXT816(0x1d),args_02)
    ;
    Log(kDebug,(string *)local_328,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328;
  }
  std::__cxx11::string::~string((string *)this_02);
LAB_00175b95:
  if (error.mCode != kNone) {
    Error::Error((Error *)local_1f0,&error);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,(Error *)local_1f0);
    std::__cxx11::string::~string((string *)(local_1f0 + 8));
  }
  SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)
  ::$_0::~__0((__0 *)&onMeshLocalPrefixResponse);
  std::_Function_base::~_Function_base((_Function_base *)&onResponse);
  coap::Message::~Message(&request);
  std::__cxx11::string::~string((string *)&uri);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&secureDissemination.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pbbrAddr);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::SetSecurePendingDataset(ErrorHandler                     aHandler,
                                               uint32_t                         aMaxRetrievalTimer,
                                               const PendingOperationalDataset &aDataset)
{
    Error         error;
    Address       pbbrAddr;
    ByteArray     secureDissemination;
    std::string   uri;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError));
    };

    auto onMeshLocalPrefixResponse = [=](Error aError) {
        if (aError == ErrorCode::kNone)
        {
            SetSecurePendingDataset(aHandler, aMaxRetrievalTimer, aDataset);
        }
        else
        {
            aHandler(aError);
        }
    };

    // Delay timer is mandatory.
    VerifyOrExit(aDataset.mPresentFlags & PendingOperationalDataset::kDelayTimerBit,
                 error = ERROR_INVALID_ARGS("Delay Timer is mandatory for a Secure Pending Operational Dataset"));

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(),
                 error = ERROR_INVALID_STATE("sending MGMT_SEC_PENDING_SET.req is only valid in CCM mode"));

    if (mProxyClient.GetMeshLocalPrefix().empty())
    {
        mProxyClient.FetchMeshLocalPrefix(onMeshLocalPrefixResponse);
        ExitNow();
    }

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtSecPendingSet));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));

    pbbrAddr = mProxyClient.GetAnycastLocator(kPrimaryBbrAloc16);
    uri      = "coaps://[" + pbbrAddr.ToString() + "]" + uri::kMgmtPendingGet;

    utils::Encode(secureDissemination, aDataset.mPendingTimestamp.Encode());
    utils::Encode(secureDissemination, aMaxRetrievalTimer);
    secureDissemination.insert(secureDissemination.end(), uri.begin(), uri.end());
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kSecureDissemination, secureDissemination}));

    SuccessOrExit(error = EncodePendingOperationalDataset(request, aDataset));

    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }

    mProxyClient.SendRequest(request, onResponse, pbbrAddr, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_SEC_PENDING_SET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}